

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.hpp
# Opt level: O0

void cppjieba::GetStringsFromWords
               (vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *strs)

{
  size_type sVar1;
  const_reference pvVar2;
  reference this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *in_RDI;
  size_t i;
  size_type in_stack_ffffffffffffffe8;
  ulong uVar3;
  ulong __n;
  
  std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::size(in_RDI);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(in_RSI,in_stack_ffffffffffffffe8);
  uVar3 = 0;
  while( true ) {
    __n = uVar3;
    sVar1 = std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::size(in_RDI);
    if (sVar1 <= uVar3) break;
    pvVar2 = std::vector<cppjieba::Word,_std::allocator<cppjieba::Word>_>::operator[](in_RDI,__n);
    this = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](in_RSI,__n);
    std::__cxx11::string::operator=((string *)this,(string *)pvVar2);
    uVar3 = __n + 1;
  }
  return;
}

Assistant:

inline void GetStringsFromWords(const vector<Word>& words, vector<string>& strs) {
  strs.resize(words.size());
  for (size_t i = 0; i < words.size(); ++i) {
    strs[i] = words[i].word;
  }
}